

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall
ExternalTester::testGlobalRule
          (ExternalTester *this,BaseFunction *f,TypeOneDRule rule,int *anisotropic,double alpha,
          double beta,vector<TestType,_std::allocator<TestType>_> *tests,int *depths,double *tols)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  TypeDepth type;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar9;
  ulong uVar10;
  size_type sVar11;
  int i;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  TestResults TVar15;
  double local_2e0;
  allocator_type local_2b2;
  allocator_type local_2b1;
  int *local_2b0;
  ExternalTester *local_2a8;
  ulong local_2a0;
  ulong local_298;
  double local_290;
  double local_288;
  double local_280;
  BaseFunction *local_278;
  value_type_conflict1 local_270;
  vector<double,_std::allocator<double>_> x;
  TasmanianSparseGrid grid_copy;
  CustomTabulated custom;
  _Vector_base<int,_std::allocator<int>_> local_138 [5];
  TasmanianSparseGrid grid;
  long local_a8;
  
  local_2a8 = this;
  local_290 = alpha;
  local_288 = beta;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid);
  local_298 = (long)(tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  bVar14 = rule != rule_fourier;
  iVar3 = (**f->_vptr_BaseFunction)(f);
  genRandom(&x,iVar3,1);
  if (rule == rule_fourier) {
    lVar12 = 0;
    while( true ) {
      iVar3 = (**f->_vptr_BaseFunction)(f);
      if (iVar3 <= lVar12) break;
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar12] = (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12] + 1.0) * 0.5;
      lVar12 = lVar12 + 1;
    }
  }
  if (rule == rule_customtabulated) {
    local_2b0 = (int *)findGaussPattersonTable();
  }
  else {
    local_2b0 = (int *)0x0;
  }
  bVar1 = std::operator==(tests,&local_2a8->quad_only);
  iVar3 = 0;
  if (!bVar1) {
    iVar3 = (*f->_vptr_BaseFunction[1])(f);
  }
  local_2a0 = (long)local_298 >> 2;
  type = (uint)bVar14 * 3 + type_level;
  pcVar9 = "global";
  if (rule == rule_fourier) {
    pcVar9 = "fourier";
  }
  bVar14 = true;
  for (uVar13 = 0; local_2a0 != uVar13; uVar13 = uVar13 + 1) {
    iVar5 = (int)&grid;
    if (rule == rule_fourier) {
      if (anisotropic == (int *)0x0) {
        iVar5 = (**f->_vptr_BaseFunction)(f);
        _grid_copy = 0;
        local_138[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        TasGrid::makeFourierGrid
                  ((TasGrid *)&custom,iVar5,iVar3,depths[uVar13],type_level,
                   (vector<int,_std::allocator<int>_> *)&grid_copy,
                   (vector<int,_std::allocator<int>_> *)local_138);
        TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&custom);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&custom);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(local_138);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&grid_copy);
      }
      else {
        iVar4 = (**f->_vptr_BaseFunction)(f);
        TasGrid::TasmanianSparseGrid::makeFourierGrid
                  (iVar5,iVar4,iVar3,depths[uVar13],(int *)0x1,anisotropic);
      }
      if (local_a8 == 0) {
        sVar11 = 0;
      }
      else {
        sVar11 = (size_type)*(int *)(local_a8 + 0x10);
      }
      local_138[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&custom,sVar11,
                 (value_type_conflict1 *)local_138,&local_2b1);
      if (local_a8 == 0) {
        sVar11 = 0;
      }
      else {
        sVar11 = (size_type)*(int *)(local_a8 + 0x10);
      }
      local_270 = 1.0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&grid_copy,sVar11,&local_270,&local_2b2)
      ;
      TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)&grid,(vector *)&custom);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&grid_copy);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&custom);
    }
    else if (anisotropic == (int *)0x0) {
      iVar5 = (**f->_vptr_BaseFunction)(f);
      _grid_copy = 0;
      local_138[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TasGrid::makeGlobalGrid
                ((TasGrid *)&custom,iVar5,iVar3,depths[uVar13],type_iptotal,rule,
                 (vector<int,_std::allocator<int>_> *)&grid_copy,local_290,local_288,
                 (char *)local_2b0,(vector<int,_std::allocator<int>_> *)local_138);
      TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&custom);
      TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&custom);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(local_138);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&grid_copy);
    }
    else {
      iVar4 = (**f->_vptr_BaseFunction)(f);
      TasGrid::TasmanianSparseGrid::makeGlobalGrid
                (iVar5,iVar4,iVar3,depths[uVar13],rule_chebyshev,(int *)(ulong)rule,local_290,
                 local_288,(char *)anisotropic,local_2b0);
    }
    TVar15 = getError(local_2a8,f,&grid,
                      (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar13],&x);
    local_280 = TVar15.error;
    if (tols[uVar13] <= local_280 && local_280 != tols[uVar13]) {
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x12;
      poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: FAILED ");
      poVar7 = std::operator<<(poVar7,pcVar9);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x19;
      TasGrid::IO::getRuleString_abi_cxx11_(rule);
      std::operator<<(poVar7,(string *)&custom);
      std::__cxx11::string::~string((string *)&custom);
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x19;
      pcVar8 = testName((tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar13]);
      poVar7 = std::operator<<((ostream *)&std::cout,pcVar8);
      poVar7 = std::operator<<(poVar7,"   failed function: ");
      iVar5 = (*f->_vptr_BaseFunction[2])(f);
      std::operator<<(poVar7,(char *)CONCAT44(extraout_var,iVar5));
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 10
      ;
      std::operator<<((ostream *)&std::cout,"  observed: ");
      poVar7 = std::ostream::_M_insert<double>(local_280);
      std::operator<<(poVar7,"  expected: ");
      poVar7 = std::ostream::_M_insert<double>(tols[uVar13]);
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar14 = false;
    }
  }
  if (rule == rule_customtabulated) {
    TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid_copy);
    local_298 = (long)local_298 >> 1;
    for (uVar13 = 0; local_298 != uVar13; uVar13 = uVar13 + 1) {
      if (uVar13 < local_2a0) {
        iVar5 = (**f->_vptr_BaseFunction)(f);
        TasGrid::TasmanianSparseGrid::makeGlobalGrid
                  ((int)&grid,iVar5,iVar3,depths[uVar13],type,(int *)0x24,local_290,local_288,
                   (char *)anisotropic,local_2b0);
      }
      else {
        custom._0_8_ = custom._0_8_ & 0xffffffff00000000;
        custom.weights.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        custom.weights.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom.nodes.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom.weights.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        custom.nodes.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        custom.nodes.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        custom.precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        custom.precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom.num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        custom.precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        custom.num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        custom.num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        custom.description._M_dataplus._M_p = (pointer)&custom.description.field_2;
        custom.description._M_string_length = 0;
        custom.description.field_2._M_local_buf[0] = '\0';
        TasGrid::CustomTabulated::read((char *)&custom);
        TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)local_138);
        TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)local_138);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_138);
        iVar5 = (**f->_vptr_BaseFunction)(f);
        TasGrid::TasmanianSparseGrid::makeGlobalGrid
                  ((int)&grid,iVar5,iVar3,depths[uVar13 % local_2a0],(CustomTabulated *)(ulong)type,
                   &custom.num_levels,anisotropic);
        TasGrid::CustomTabulated::~CustomTabulated(&custom);
      }
      TasGrid::TasmanianSparseGrid::operator=(&grid_copy,&grid);
      uVar10 = uVar13 % local_2a0;
      TVar15 = getError(local_2a8,f,&grid_copy,
                        (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar10],&x);
      local_280 = TVar15.error;
      if (tols[uVar10] <= local_280 && local_280 != tols[uVar10]) {
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x12;
        poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: FAILED global");
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x19;
        TasGrid::IO::getRuleString_abi_cxx11_(rule);
        std::operator<<(poVar7,(string *)&custom);
        std::__cxx11::string::~string((string *)&custom);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x19;
        pcVar9 = testName((tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
        poVar7 = std::operator<<((ostream *)&std::cout,pcVar9);
        poVar7 = std::operator<<(poVar7,"   failed function: ");
        iVar5 = (*f->_vptr_BaseFunction[2])(f);
        std::operator<<(poVar7,(char *)CONCAT44(extraout_var_00,iVar5));
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             10;
        std::operator<<((ostream *)&std::cout,"observed: ");
        poVar7 = std::ostream::_M_insert<double>(local_280);
        std::operator<<(poVar7,"  expected: ");
        poVar7 = std::ostream::_M_insert<double>(tols[uVar10]);
        std::endl<char,std::char_traits<char>>(poVar7);
        bVar14 = false;
      }
    }
    TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid_copy);
  }
  cVar2 = TasGrid::OneDimensionalMeta::isSequence(rule);
  if (cVar2 != '\0') {
    local_278 = f;
    for (uVar13 = 0; local_2a0 != uVar13; uVar13 = uVar13 + 1) {
      if ((tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar13] == type_integration) {
        iVar3 = (**f->_vptr_BaseFunction)(f);
        TasGrid::TasmanianSparseGrid::makeSequenceGrid
                  ((int)&grid,iVar3,0,depths[uVar13],type,(int *)(ulong)rule,anisotropic);
        custom.num_levels = 0;
        custom._4_4_ = 0;
        custom.num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        custom.num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        TVar15 = getError(local_2a8,f,&grid,type_integration,
                          (vector<double,_std::allocator<double>_> *)&custom);
        local_2e0 = TVar15.error;
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&custom);
      }
      else {
        iVar5 = (**f->_vptr_BaseFunction)(f);
        iVar4 = (*f->_vptr_BaseFunction[1])(f);
        iVar3 = depths[uVar13];
        if (anisotropic == (int *)0x0) {
          _grid_copy = 0;
        }
        else {
          iVar6 = (**local_278->_vptr_BaseFunction)();
          std::vector<int,std::allocator<int>>::vector<int_const*,void>
                    ((vector<int,std::allocator<int>> *)&grid_copy,anisotropic,anisotropic + iVar6,
                     (allocator_type *)&local_270);
        }
        local_138[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        TasGrid::makeSequenceGrid
                  ((TasGrid *)&custom,iVar5,iVar4,iVar3,type,rule,
                   (vector<int,_std::allocator<int>_> *)&grid_copy,
                   (vector<int,_std::allocator<int>_> *)local_138);
        TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&custom);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&custom);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(local_138);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&grid_copy);
        f = local_278;
        TVar15 = getError(local_2a8,local_278,&grid,
                          (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar13],&x);
        local_2e0 = TVar15.error;
      }
      if (tols[uVar13] <= local_2e0 && local_2e0 != tols[uVar13]) {
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x12;
        poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: FAILED sequence");
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x19;
        TasGrid::IO::getRuleString_abi_cxx11_(rule);
        std::operator<<(poVar7,(string *)&custom);
        std::__cxx11::string::~string((string *)&custom);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x19;
        pcVar9 = testName((tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
        poVar7 = std::operator<<((ostream *)&std::cout,pcVar9);
        poVar7 = std::operator<<(poVar7,"   failed function: ");
        iVar3 = (*f->_vptr_BaseFunction[2])(f);
        std::operator<<(poVar7,(char *)CONCAT44(extraout_var_01,iVar3));
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             10;
        std::operator<<((ostream *)&std::cout,"  observed: ");
        poVar7 = std::ostream::_M_insert<double>(local_2e0);
        std::operator<<(poVar7,"  expected: ");
        poVar7 = std::ostream::_M_insert<double>(tols[uVar13]);
        std::endl<char,std::char_traits<char>>(poVar7);
        bVar14 = false;
      }
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  return bVar14;
}

Assistant:

bool ExternalTester::testGlobalRule(const BaseFunction *f, TasGrid::TypeOneDRule rule, const int *anisotropic, double alpha, double beta, const std::vector<TestType> &tests, const int depths[], const double tols[]) const{
    TasGrid::TasmanianSparseGrid grid;
    TestResults R;
    size_t num_global_tests = tests.size();
    TasGrid::TypeDepth type = (rule == rule_fourier ? TasGrid::type_level : TasGrid::type_iptotal);
    std::vector<double> x = genRandom(f->getNumInputs());
    if (rule == rule_fourier){ for(int i=0; i<f->getNumInputs(); i++) x[i] = 0.5*(x[i]+1.0); }    // map to canonical [0,1]^d
    bool bPass = true;
    const char *custom_filename = (rule == rule_customtabulated) ? findGaussPattersonTable() : 0;
    int num_fn_outputs = (tests == quad_only) ? 0 : f->getNumOutputs();
    for(size_t i=0; i<num_global_tests; i++){
        if (rule == rule_fourier){
            if (anisotropic == nullptr){
                grid = makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type);
            }else{
                grid.makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, anisotropic);
            }
            grid.setDomainTransform(std::vector<double>(grid.getNumDimensions(), -1.0), std::vector<double>(grid.getNumDimensions(), 1.0));
        }else{
            if (anisotropic == nullptr){
                grid = makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, std::vector<int>(), alpha, beta, custom_filename);
            }else{
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }
        }
        R = getError(f, grid, tests[i], x);
        if (R.error > tols[i]){
            bPass = false;
            cout << setw(18) << "ERROR: FAILED " << (rule == rule_fourier ? "fourier" : "global") << setw(25) << IO::getRuleString(rule);
            cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
            cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
        }
    }
    if (rule == rule_customtabulated){
        TasGrid::TasmanianSparseGrid grid_copy;
        for(size_t i=0; i<2*num_global_tests; i++){
            if (i < num_global_tests){
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }else{
                CustomTabulated custom;
                custom.read(custom_filename);
                grid = TasmanianSparseGrid();
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i % num_global_tests], type, std::move(custom), anisotropic);
            }
            grid_copy = grid;
            R = getError(f, grid_copy, tests[i % num_global_tests], x);
            if (R.error > tols[i % num_global_tests]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED global" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i % num_global_tests]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "observed: " << R.error << "  expected: " << tols[i % num_global_tests] << endl;
            }
        }
    }

    if (TasGrid::OneDimensionalMeta::isSequence(rule)){
        for(size_t i=0; i<num_global_tests; i++){
            if (tests[i] == type_integration){
                grid.makeSequenceGrid(f->getNumInputs(), 0, depths[i], type, rule, anisotropic);
                R = getError(f, grid, type_integration);
            }else{
                grid = makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), depths[i], type, rule,
                                        (anisotropic != nullptr) ? std::vector<int>(anisotropic, anisotropic + f->getNumInputs()) : std::vector<int>());
                R = getError(f, grid, tests[i], x);
            }
            if (R.error > tols[i]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED sequence" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
            }
        }
    }
    return bPass;
}